

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_0::renderPassContinueTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkImage obj;
  VkImageView obj_00;
  VkFramebuffer obj_01;
  TextureFormat TVar1;
  VkBuffer obj_02;
  long *plVar2;
  undefined8 uVar3;
  void *pvVar4;
  undefined8 uVar5;
  VkAttachmentDescription *pVVar6;
  deUint32 dVar7;
  Allocator *pAVar8;
  VkCommandBuffer apVVar9 [1];
  undefined1 auVar10 [8];
  TestStatus *pTVar11;
  VkAttachmentReference VVar12;
  VkAllocationCallbacks *pVVar13;
  Handle<(vk::HandleType)9> HVar14;
  Handle<(vk::HandleType)13> HVar15;
  Handle<(vk::HandleType)23> HVar16;
  deUint32 dVar17;
  VkResult VVar18;
  int iVar19;
  DeviceInterface *pDVar20;
  VkDevice pVVar21;
  DeviceInterface *vk;
  TextureLevel *this;
  byte *pbVar22;
  long lVar23;
  long lVar24;
  byte *pbVar25;
  ulong size;
  VkRenderPassCreateInfo renderPassCreateInfo;
  VkBufferImageCopy copyRegion;
  PixelBufferAccess pixelBufferAccess;
  VkAttachmentReference colorAttRef;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_210;
  VkCommandBuffer secondaryCommandBuffer;
  CommandBufferRenderPassTestEnvironment env;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  VkImageView attachmentViews [1];
  undefined1 local_a8 [8];
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_a0;
  TestStatus *local_80;
  TextureFormat tcuFormat;
  VkClearAttachment clearAttachment;
  VkClearRect clearRect;
  TextureFormat local_38;
  
  local_80 = __return_storage_ptr__;
  pDVar20 = Context::getDeviceInterface(context);
  env.super_CommandBufferBareTestEnvironment<1U>.m_context = context;
  pVVar21 = Context::getDevice(context);
  env.super_CommandBufferBareTestEnvironment<1U>.m_device = pVVar21;
  vk = Context::getDeviceInterface(context);
  env.super_CommandBufferBareTestEnvironment<1U>.m_vkd = vk;
  env.super_CommandBufferBareTestEnvironment<1U>.m_queue = Context::getUniversalQueue(context);
  dVar17 = Context::getUniversalQueueFamilyIndex(context);
  env.super_CommandBufferBareTestEnvironment<1U>.m_queueFamilyIndex = dVar17;
  env.super_CommandBufferBareTestEnvironment<1U>.m_allocator = Context::getDefaultAllocator(context)
  ;
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&renderPassCreateInfo,vk,pVVar21,2,dVar17,
             (VkAllocationCallbacks *)0x0);
  pVVar6 = renderPassCreateInfo.pAttachments;
  uVar5 = renderPassCreateInfo._16_8_;
  pvVar4 = renderPassCreateInfo.pNext;
  uVar3 = renderPassCreateInfo._0_8_;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = renderPassCreateInfo.flags;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] =
       renderPassCreateInfo.attachmentCount;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] =
       (int)renderPassCreateInfo.pAttachments;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] =
       (int)((ulong)renderPassCreateInfo.pAttachments >> 0x20);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = renderPassCreateInfo.sType;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.type = renderPassCreateInfo._4_4_;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_ = renderPassCreateInfo.pNext;
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassCreateInfo._4_4_ = 0;
  renderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.flags = 0;
  renderPassCreateInfo.attachmentCount = 0;
  renderPassCreateInfo.pAttachments = (VkAttachmentDescription *)0x0;
  if (env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
      super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal == 0) {
    env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
    super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)uVar5;
    env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
    super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)pVVar6;
    env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
    super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = uVar3;
    env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
    super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)pvVar4;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
                super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               (VkCommandPool)
               env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
               super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
    env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
    super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)
         CONCAT44(pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2],
                  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1]);
    env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
    super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
         (VkDevice)pixelBufferAccess.super_ConstPixelBufferAccess._16_8_;
    env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
    super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._0_4_ =
         pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order;
    env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
    super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._4_4_ =
         pixelBufferAccess.super_ConstPixelBufferAccess.m_format.type;
    env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
    super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
    if (renderPassCreateInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&renderPassCreateInfo.pNext,
                 (VkCommandPool)renderPassCreateInfo._0_8_);
    }
  }
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = 0x28;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] =
       (undefined4)
       env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
       super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] =
       env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
       super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._4_4_;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 1;
  VVar18 = (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x47])
                     (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                      env.super_CommandBufferBareTestEnvironment<1U>.m_device,
                      (VkSubpassDescription *)&pixelBufferAccess);
  ::vk::checkResult(VVar18,
                    "m_vkd.allocateCommandBuffers(m_device, &cmdBufferAllocateInfo, m_primaryCommandBuffers)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x66);
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)0x0;
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)0x0;
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
  m_internal = 0;
  memset(&env.m_colorImage,0,0x88);
  renderPassCreateInfo.pAttachments = (VkAttachmentDescription *)&copyRegion;
  copyRegion.bufferOffset._0_4_ = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  copyRegion.imageSubresource.aspectMask = 0;
  copyRegion.imageSubresource.layerCount = 0;
  copyRegion.bufferOffset._4_4_ = 0x29;
  copyRegion.bufferRowLength = 1;
  copyRegion.bufferImageHeight = 1;
  copyRegion.imageSubresource.mipLevel = 2;
  copyRegion.imageSubresource.baseArrayLayer = 1;
  copyRegion.imageOffset.x = 2;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data = &colorAttRef;
  colorAttRef.attachment = 0;
  colorAttRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = R;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 1;
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.flags = 0;
  renderPassCreateInfo.attachmentCount = 1;
  renderPassCreateInfo.subpassCount = 1;
  renderPassCreateInfo._48_8_ = (ulong)(uint)renderPassCreateInfo._52_4_ << 0x20;
  renderPassCreateInfo.pDependencies = (VkSubpassDependency *)0x0;
  renderPassCreateInfo.pSubpasses = (VkSubpassDescription *)&pixelBufferAccess;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)local_a8,
             env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,&renderPassCreateInfo,
             (VkAllocationCallbacks *)0x0);
  env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       DStack_a0.m_allocator;
  env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       DStack_a0.m_device;
  env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       DStack_a0.m_deviceIface;
  auVar10 = local_a8;
  attachmentViews[0].m_internal = (VkImageView)(VkImageView)local_a8;
  local_a8._0_4_ = R;
  local_a8._4_4_ = SNORM_INT8;
  DStack_a0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_a0.m_device = (VkDevice)0x0;
  DStack_a0.m_allocator = (VkAllocationCallbacks *)0x0;
  if (env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal == 0)
  {
    env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
         (deUint64)auVar10;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               (VkRenderPass)
               env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
               m_internal);
    env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
         (deUint64)attachmentViews[0].m_internal;
    if ((TextureFormat)local_a8 != (TextureFormat)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                (&DStack_a0,(VkRenderPass)local_a8);
    }
  }
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = sRGB;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 1;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0x29;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0xff;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ = 0xff;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_ = 1;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&copyRegion,
                    env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                    env.super_CommandBufferBareTestEnvironment<1U>.m_device,
                    (VkImageCreateInfo *)&pixelBufferAccess,(VkAllocationCallbacks *)0x0);
  renderPassCreateInfo._0_8_ =
       CONCAT44(copyRegion.bufferOffset._4_4_,(ChannelOrder)copyRegion.bufferOffset);
  renderPassCreateInfo.pNext =
       (void *)CONCAT44(copyRegion.bufferImageHeight,copyRegion.bufferRowLength);
  renderPassCreateInfo._16_8_ =
       CONCAT44(copyRegion.imageSubresource.mipLevel,copyRegion.imageSubresource.aspectMask);
  renderPassCreateInfo.pAttachments =
       (VkAttachmentDescription *)
       CONCAT44(copyRegion.imageSubresource.layerCount,copyRegion.imageSubresource.baseArrayLayer);
  copyRegion.bufferOffset._0_4_ = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  copyRegion.bufferOffset._4_4_ = 0;
  copyRegion.bufferRowLength = 0;
  copyRegion.bufferImageHeight = 0;
  copyRegion.imageSubresource.aspectMask = 0;
  copyRegion.imageSubresource.mipLevel = 0;
  copyRegion.imageSubresource.baseArrayLayer = 0;
  copyRegion.imageSubresource.layerCount = 0;
  HVar14.m_internal = renderPassCreateInfo._0_8_;
  env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)renderPassCreateInfo.pNext;
  env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)renderPassCreateInfo._16_8_;
  env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)renderPassCreateInfo.pAttachments;
  if (env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0)
  {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object
                        .m_internal);
    obj.m_internal._4_4_ = copyRegion.bufferOffset._4_4_;
    obj.m_internal._0_4_ = (ChannelOrder)copyRegion.bufferOffset;
    env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         (VkDevice)renderPassCreateInfo._16_8_;
    env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)renderPassCreateInfo.pAttachments;
    env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
         renderPassCreateInfo._0_8_;
    env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)renderPassCreateInfo.pNext;
    HVar14.m_internal =
         env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
    if (obj.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&copyRegion.bufferRowLength,obj);
      HVar14 = env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object;
    }
  }
  env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       HVar14.m_internal;
  pAVar8 = env.super_CommandBufferBareTestEnvironment<1U>.m_allocator;
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)&pixelBufferAccess,
             env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,
             (VkImage)env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal);
  (*pAVar8->_vptr_Allocator[3])(&renderPassCreateInfo,pAVar8,&pixelBufferAccess,0);
  uVar3 = renderPassCreateInfo._0_8_;
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassCreateInfo._4_4_ = 0;
  if (env.m_colorImageMemory.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)uVar3) {
    if (env.m_colorImageMemory.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
        .m_data.ptr == (Allocation *)0x0) {
      env.m_colorImageMemory.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr = (Allocation *)uVar3;
    }
    else {
      (*(env.m_colorImageMemory.
         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
        _vptr_Allocation[1])();
      env.m_colorImageMemory.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr = (Allocation *)uVar3;
      if (renderPassCreateInfo._0_8_ != 0) {
        (**(code **)(*(long *)renderPassCreateInfo._0_8_ + 8))();
      }
    }
  }
  VVar18 = (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0xd])
                     (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                      env.super_CommandBufferBareTestEnvironment<1U>.m_device,
                      env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,
                      ((env.m_colorImageMemory.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                       .ptr)->m_memory).m_internal);
  ::vk::checkResult(VVar18,
                    "m_vkd.bindImageMemory(m_device, *m_colorImage, m_colorImageMemory->getMemory(), m_colorImageMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xf0);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = sRGBA;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess._16_8_ =
       pixelBufferAccess.super_ConstPixelBufferAccess._16_8_ & 0xffffffff00000000;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] =
       (int)env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] =
       (int)(env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
            >> 0x20);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ = 1;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_ = 0x29;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&copyRegion,
             env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,
             (VkImageViewCreateInfo *)&pixelBufferAccess,(VkAllocationCallbacks *)0x0);
  renderPassCreateInfo._0_8_ =
       CONCAT44(copyRegion.bufferOffset._4_4_,(ChannelOrder)copyRegion.bufferOffset);
  renderPassCreateInfo.pNext =
       (void *)CONCAT44(copyRegion.bufferImageHeight,copyRegion.bufferRowLength);
  renderPassCreateInfo._16_8_ =
       CONCAT44(copyRegion.imageSubresource.mipLevel,copyRegion.imageSubresource.aspectMask);
  renderPassCreateInfo.pAttachments =
       (VkAttachmentDescription *)
       CONCAT44(copyRegion.imageSubresource.layerCount,copyRegion.imageSubresource.baseArrayLayer);
  copyRegion.bufferOffset._0_4_ = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  copyRegion.bufferOffset._4_4_ = 0;
  copyRegion.bufferRowLength = 0;
  copyRegion.bufferImageHeight = 0;
  copyRegion.imageSubresource.aspectMask = 0;
  copyRegion.imageSubresource.mipLevel = 0;
  copyRegion.imageSubresource.baseArrayLayer = 0;
  copyRegion.imageSubresource.layerCount = 0;
  HVar15.m_internal = renderPassCreateInfo._0_8_;
  env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)renderPassCreateInfo.pNext;
  env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)renderPassCreateInfo._16_8_;
  env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)renderPassCreateInfo.pAttachments;
  if (env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               (VkImageView)
               env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
               m_internal);
    obj_00.m_internal._4_4_ = copyRegion.bufferOffset._4_4_;
    obj_00.m_internal._0_4_ = (ChannelOrder)copyRegion.bufferOffset;
    env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
         (VkDevice)renderPassCreateInfo._16_8_;
    env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)renderPassCreateInfo.pAttachments;
    env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
         renderPassCreateInfo._0_8_;
    env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)renderPassCreateInfo.pNext;
    HVar15.m_internal =
         env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
         m_internal;
    if (obj_00.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&copyRegion.bufferRowLength,obj_00);
      HVar15 = env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object;
    }
  }
  env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
       HVar15.m_internal;
  attachmentViews[0].m_internal =
       (VkImageView)
       (VkImageView)
       env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = 0x25;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess._16_8_ =
       pixelBufferAccess.super_ConstPixelBufferAccess._16_8_ & 0xffffffff00000000;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] =
       (int)env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal
  ;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] =
       (int)(env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal >> 0x20);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ = 1;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&copyRegion,
             env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,
             (VkFramebufferCreateInfo *)&pixelBufferAccess,(VkAllocationCallbacks *)0x0);
  renderPassCreateInfo._0_8_ =
       CONCAT44(copyRegion.bufferOffset._4_4_,(ChannelOrder)copyRegion.bufferOffset);
  renderPassCreateInfo.pNext =
       (void *)CONCAT44(copyRegion.bufferImageHeight,copyRegion.bufferRowLength);
  renderPassCreateInfo._16_8_ =
       CONCAT44(copyRegion.imageSubresource.mipLevel,copyRegion.imageSubresource.aspectMask);
  renderPassCreateInfo.pAttachments =
       (VkAttachmentDescription *)
       CONCAT44(copyRegion.imageSubresource.layerCount,copyRegion.imageSubresource.baseArrayLayer);
  copyRegion.bufferOffset._0_4_ = R;
  copyRegion.bufferOffset._4_4_ = SNORM_INT8;
  copyRegion.bufferRowLength = 0;
  copyRegion.bufferImageHeight = 0;
  copyRegion.imageSubresource.aspectMask = 0;
  copyRegion.imageSubresource.mipLevel = 0;
  copyRegion.imageSubresource.baseArrayLayer = 0;
  copyRegion.imageSubresource.layerCount = 0;
  HVar16.m_internal = renderPassCreateInfo._0_8_;
  env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)renderPassCreateInfo.pNext;
  env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)renderPassCreateInfo._16_8_;
  env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)renderPassCreateInfo.pAttachments;
  if (env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               (VkFramebuffer)
               env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
               m_internal);
    obj_01.m_internal._4_4_ = copyRegion.bufferOffset._4_4_;
    obj_01.m_internal._0_4_ = (ChannelOrder)copyRegion.bufferOffset;
    env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
         (VkDevice)renderPassCreateInfo._16_8_;
    env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)renderPassCreateInfo.pAttachments;
    env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
         renderPassCreateInfo._0_8_;
    env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)renderPassCreateInfo.pNext;
    HVar16.m_internal =
         env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
    if (obj_01.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)23>_> *)&copyRegion.bufferRowLength,obj_01);
      HVar16 = env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object;
    }
  }
  env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       HVar16.m_internal;
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  renderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.flags =
       (undefined4)
       env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
       super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  renderPassCreateInfo.attachmentCount =
       env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
       super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._4_4_;
  renderPassCreateInfo.pAttachments = (VkAttachmentDescription *)0x100000001;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&copyRegion,
             env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,
             (VkCommandBufferAllocateInfo *)&renderPassCreateInfo);
  dVar7 = copyRegion.imageSubresource.layerCount;
  dVar17 = copyRegion.imageSubresource.baseArrayLayer;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.type = copyRegion.bufferOffset._4_4_;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order =
       (ChannelOrder)copyRegion.bufferOffset;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_ =
       CONCAT44(copyRegion.bufferImageHeight,copyRegion.bufferRowLength);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] =
       copyRegion.imageSubresource.mipLevel;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] =
       copyRegion.imageSubresource.aspectMask;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] =
       copyRegion.imageSubresource.baseArrayLayer;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] =
       copyRegion.imageSubresource.layerCount;
  copyRegion.bufferOffset._0_4_ = R;
  copyRegion.bufferOffset._4_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
  copyRegion.bufferRowLength = 0;
  copyRegion.bufferImageHeight = 0;
  copyRegion.imageSubresource.aspectMask = 0;
  copyRegion.imageSubresource.mipLevel = 0;
  copyRegion.imageSubresource.baseArrayLayer = 0;
  copyRegion.imageSubresource.layerCount = 0;
  if (env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object ==
      (VkCommandBuffer_s *)0x0) {
    env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
    m_internal = CONCAT44(dVar7,dVar17);
    env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
         (VkDevice)pixelBufferAccess.super_ConstPixelBufferAccess._16_8_;
    env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
         (VkCommandBuffer_s *)pixelBufferAccess.super_ConstPixelBufferAccess.m_format;
    env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
  }
  else {
    attachmentViews[0].m_internal =
         (VkImageView)
         (VkImageView)
         env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    (*(env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
      m_deviceIface)->_vptr_DeviceInterface[0x48])
              (env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
               m_deviceIface,
               env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
               m_device,env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                        deleter.m_pool.m_internal,1);
    TVar1.type = copyRegion.bufferOffset._4_4_;
    TVar1.order = (ChannelOrder)copyRegion.bufferOffset;
    env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
         (VkDevice)pixelBufferAccess.super_ConstPixelBufferAccess._16_8_;
    env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
    m_internal._4_4_ = pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2];
    env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
    m_internal._0_4_ = pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1];
    env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
         (VkCommandBuffer_s *)pixelBufferAccess.super_ConstPixelBufferAccess.m_format;
    env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
    if (TVar1 != (TextureFormat)0x0) {
      pixelBufferAccess.super_ConstPixelBufferAccess.m_format = TVar1;
      (**(code **)(*(long *)CONCAT44(copyRegion.bufferImageHeight,copyRegion.bufferRowLength) +
                  0x240))((long *)CONCAT44(copyRegion.bufferImageHeight,copyRegion.bufferRowLength),
                          CONCAT44(copyRegion.imageSubresource.mipLevel,
                                   copyRegion.imageSubresource.aspectMask),
                          CONCAT44(copyRegion.imageSubresource.layerCount,
                                   copyRegion.imageSubresource.baseArrayLayer),1);
    }
  }
  apVVar9[0] = env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0];
  secondaryCommandBuffer =
       env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  clearAttachment.aspectMask = 1;
  clearAttachment.colorAttachment = 0;
  clearAttachment.clearValue._0_4_ = 2.8026e-45;
  clearAttachment.clearValue._4_4_ = 0x2f;
  clearAttachment.clearValue._8_8_ = 0xd300000083;
  clearRect.rect.offset.x = 0;
  clearRect.rect.offset.y = 0;
  clearRect.rect.extent.width = 0xff;
  clearRect.rect.extent.height = 0xff;
  clearRect.baseArrayLayer = 0;
  clearRect.layerCount = 1;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = 0x29;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] =
       (undefined4)
       env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] =
       env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal.
       _4_4_;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ =
       SUB84(env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
             m_internal,0);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_ =
       SUB84(env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
             m_internal >> 0x20,0);
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  renderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.flags = 2;
  renderPassCreateInfo.pAttachments = (VkAttachmentDescription *)&pixelBufferAccess;
  VVar18 = (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x49])
                     (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                      env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                      object,&renderPassCreateInfo);
  ::vk::checkResult(VVar18,
                    "m_vkd.beginCommandBuffer(*m_secondaryCommandBuffer, &commandBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x16c);
  (*pDVar20->_vptr_DeviceInterface[0x68])
            (pDVar20,secondaryCommandBuffer,1,&clearAttachment,1,&clearRect);
  VVar18 = (*pDVar20->_vptr_DeviceInterface[0x4a])(pDVar20,secondaryCommandBuffer);
  ::vk::checkResult(VVar18,"vkd.endCommandBuffer(secondaryCommandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x872);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = 0x2a;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  VVar18 = (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x49])
                     (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                      env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0]);
  ::vk::checkResult(VVar18,
                    "m_vkd.beginCommandBuffer(m_primaryCommandBuffers[0], &commandBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x151);
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO;
  renderPassCreateInfo._4_4_ = 0x3b;
  renderPassCreateInfo.pNext = (void *)0xfb000000a3;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = 0x2b;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] =
       (undefined4)
       env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] =
       env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal.
       _4_4_;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] =
       (int)env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
            m_internal;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] =
       (int)(env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
             m_internal >> 0x20);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_ = 0;
  (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x74])
            (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0],
             &pixelBufferAccess,1);
  (*pDVar20->_vptr_DeviceInterface[0x77])(pDVar20,apVVar9[0],1,&secondaryCommandBuffer);
  (*pDVar20->_vptr_DeviceInterface[0x76])(pDVar20,apVVar9[0]);
  VVar18 = (*pDVar20->_vptr_DeviceInterface[0x4a])(pDVar20,apVVar9[0]);
  ::vk::checkResult(VVar18,"vkd.endCommandBuffer(primaryCommandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x87a);
  CommandBufferRenderPassTestEnvironment::submitPrimaryCommandBuffer(&env);
  DStack_210.m_device = (VkDevice)0x0;
  DStack_210.m_allocator = (VkAllocationCallbacks *)0x0;
  colorAttRef.attachment = 0;
  colorAttRef.layout = VK_IMAGE_LAYOUT_UNDEFINED;
  DStack_210.m_deviceIface = (DeviceInterface *)0x0;
  tcuFormat = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UINT);
  iVar19 = tcu::TextureFormat::getPixelSize(&tcuFormat);
  this = (TextureLevel *)operator_new(0x28);
  tcu::TextureLevel::TextureLevel(this,&tcuFormat,0xff,0xff,1);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = iVar19 * 0xfe01;
  size = (ulong)(uint)pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1];
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = sR;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess._16_8_ =
       pixelBufferAccess.super_ConstPixelBufferAccess._16_8_ & 0xffffffff00000000;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ = 2;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_ = 0;
  result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr =
       this;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&copyRegion,
                     env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                     env.super_CommandBufferBareTestEnvironment<1U>.m_device,
                     (VkBufferCreateInfo *)&pixelBufferAccess,(VkAllocationCallbacks *)0x0);
  renderPassCreateInfo._4_4_ = copyRegion.bufferOffset._4_4_;
  renderPassCreateInfo.sType = (ChannelOrder)copyRegion.bufferOffset;
  renderPassCreateInfo.pNext =
       (void *)CONCAT44(copyRegion.bufferImageHeight,copyRegion.bufferRowLength);
  renderPassCreateInfo._16_8_ =
       CONCAT44(copyRegion.imageSubresource.mipLevel,copyRegion.imageSubresource.aspectMask);
  renderPassCreateInfo.pAttachments =
       (VkAttachmentDescription *)
       CONCAT44(copyRegion.imageSubresource.layerCount,copyRegion.imageSubresource.baseArrayLayer);
  copyRegion.bufferOffset._0_4_ = 0;
  copyRegion.bufferOffset._4_4_ = 0;
  copyRegion.bufferRowLength = 0;
  copyRegion.bufferImageHeight = 0;
  copyRegion.imageSubresource.aspectMask = 0;
  copyRegion.imageSubresource.mipLevel = 0;
  copyRegion.imageSubresource.baseArrayLayer = 0;
  copyRegion.imageSubresource.layerCount = 0;
  VVar12 = (VkAttachmentReference)renderPassCreateInfo._0_8_;
  pDVar20 = (DeviceInterface *)renderPassCreateInfo.pNext;
  pVVar21 = (VkDevice)renderPassCreateInfo._16_8_;
  pVVar13 = (VkAllocationCallbacks *)renderPassCreateInfo.pAttachments;
  if (colorAttRef != (VkAttachmentReference)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_210,(VkBuffer)colorAttRef);
    obj_02.m_internal._4_4_ = copyRegion.bufferOffset._4_4_;
    obj_02.m_internal._0_4_ = (ChannelOrder)copyRegion.bufferOffset;
    colorAttRef.attachment = renderPassCreateInfo.sType;
    colorAttRef.layout = renderPassCreateInfo._4_4_;
    DStack_210.m_deviceIface = (DeviceInterface *)renderPassCreateInfo.pNext;
    DStack_210.m_device = (VkDevice)renderPassCreateInfo._16_8_;
    DStack_210.m_allocator = (VkAllocationCallbacks *)renderPassCreateInfo.pAttachments;
    VVar12 = colorAttRef;
    pDVar20 = DStack_210.m_deviceIface;
    pVVar21 = DStack_210.m_device;
    pVVar13 = DStack_210.m_allocator;
    if (obj_02.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&copyRegion.bufferRowLength,obj_02);
      VVar12 = colorAttRef;
      pDVar20 = DStack_210.m_deviceIface;
      pVVar21 = DStack_210.m_device;
      pVVar13 = DStack_210.m_allocator;
    }
  }
  DStack_210.m_allocator = pVVar13;
  DStack_210.m_device = pVVar21;
  DStack_210.m_deviceIface = pDVar20;
  colorAttRef = VVar12;
  pAVar8 = env.super_CommandBufferBareTestEnvironment<1U>.m_allocator;
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&renderPassCreateInfo,
             env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,(VkBuffer)colorAttRef);
  (*pAVar8->_vptr_Allocator[3])(&copyRegion,pAVar8,&renderPassCreateInfo,1);
  plVar2 = (long *)CONCAT44(copyRegion.bufferOffset._4_4_,(ChannelOrder)copyRegion.bufferOffset);
  VVar18 = (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0xc])
                     (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                      env.super_CommandBufferBareTestEnvironment<1U>.m_device,colorAttRef,plVar2[1],
                      plVar2[2]);
  ::vk::checkResult(VVar18,
                    "m_vkd.bindBufferMemory(m_device, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x19e);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = 0x2d;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x100;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x800;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 2;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 6;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ = 0xffffffff;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_ = 0xffffffff;
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  renderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.flags = 0x1000;
  renderPassCreateInfo.attachmentCount = 0x2000;
  renderPassCreateInfo.pAttachments = (VkAttachmentDescription *)0xffffffffffffffff;
  renderPassCreateInfo.subpassCount = colorAttRef.attachment;
  renderPassCreateInfo._36_4_ = colorAttRef.layout;
  renderPassCreateInfo.pSubpasses = (VkSubpassDescription *)0x0;
  copyRegion.imageExtent.height = 0xff;
  copyRegion.imageExtent.depth = 1;
  copyRegion.imageOffset.x = 0;
  copyRegion.imageOffset.y = 0;
  copyRegion.imageOffset.z = 0;
  copyRegion.imageExtent.width = 0xff;
  copyRegion.imageSubresource.aspectMask = 1;
  copyRegion.imageSubresource.mipLevel = 0;
  copyRegion.imageSubresource.baseArrayLayer = 0;
  copyRegion.imageSubresource.layerCount = 1;
  copyRegion.bufferOffset._0_4_ = 0;
  copyRegion.bufferOffset._4_4_ = 0;
  copyRegion.bufferRowLength = 0xff;
  copyRegion.bufferImageHeight = 0xff;
  attachmentViews[0].m_internal = (VkImageView)0x2a;
  renderPassCreateInfo._48_8_ = size;
  VVar18 = (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x49])
                     (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                      env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0]);
  ::vk::checkResult(VVar18,
                    "m_vkd.beginCommandBuffer(m_primaryCommandBuffers[0], &commandBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x151);
  (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x6d])
            (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0],0x400,0x1000,
             0,0,0,0,0,1,(VkBufferCreateInfo *)&pixelBufferAccess);
  (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[99])
            (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0],
             env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
             ,6,colorAttRef,1,&copyRegion);
  (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x6d])
            (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0],0x1000,1,0,0,
             0,1,&renderPassCreateInfo,0,0);
  VVar18 = (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x4a])
                     (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                      env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0]);
  ::vk::checkResult(VVar18,"m_vkd.endCommandBuffer(m_primaryCommandBuffers[0])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x1d4);
  CommandBufferRenderPassTestEnvironment::submitPrimaryCommandBuffer(&env);
  ::vk::invalidateMappedMemoryRange
            (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,(VkDeviceMemory)plVar2[1],
             plVar2[2],size);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)attachmentViews,this);
  local_38 = this->m_format;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_a8,&local_38,&this->m_size,(void *)plVar2[3]);
  tcu::copy((EVP_PKEY_CTX *)attachmentViews,(EVP_PKEY_CTX *)local_a8);
  (**(code **)(*plVar2 + 8))(plVar2);
  if (colorAttRef != (VkAttachmentReference)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_210,(VkBuffer)colorAttRef);
  }
  tcu::TextureLevel::getAccess
            (&pixelBufferAccess,
             result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
             m_data.ptr);
  pTVar11 = local_80;
  pbVar22 = (byte *)CONCAT44(pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_,
                             pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_);
  lVar23 = 0;
  do {
    lVar24 = 0;
    pbVar25 = pbVar22;
    do {
      if (*(uint *)((long)&DAT_00ad5b90 + lVar24) != (uint)*pbVar25) {
        renderPassCreateInfo._0_8_ = &renderPassCreateInfo.flags;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&renderPassCreateInfo,"clear value mismatch","");
        pTVar11->m_code = QP_TEST_RESULT_FAIL;
        (pTVar11->m_description)._M_dataplus._M_p = (pointer)&(pTVar11->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pTVar11->m_description,renderPassCreateInfo._0_8_,
                   (long)renderPassCreateInfo.pNext + renderPassCreateInfo._0_8_);
        goto LAB_00451ddd;
      }
      pbVar25 = pbVar25 + 1;
      lVar24 = lVar24 + 4;
    } while (lVar24 != 0x10);
    lVar23 = lVar23 + 1;
    pbVar22 = pbVar22 + 4;
  } while (lVar23 != 0xfe01);
  renderPassCreateInfo._0_8_ = &renderPassCreateInfo.flags;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&renderPassCreateInfo,"render pass continue test passed","");
  pTVar11->m_code = QP_TEST_RESULT_PASS;
  (pTVar11->m_description)._M_dataplus._M_p = (pointer)&(pTVar11->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar11->m_description,renderPassCreateInfo._0_8_,
             (long)renderPassCreateInfo.pNext + renderPassCreateInfo._0_8_);
LAB_00451ddd:
  if ((VkRenderPassCreateFlags *)renderPassCreateInfo._0_8_ != &renderPassCreateInfo.flags) {
    operator_delete((void *)renderPassCreateInfo._0_8_,renderPassCreateInfo._16_8_ + 1);
  }
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            (&result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
  CommandBufferRenderPassTestEnvironment::~CommandBufferRenderPassTestEnvironment(&env);
  return pTVar11;
}

Assistant:

tcu::TestStatus renderPassContinueTest(Context& context)
{
	const DeviceInterface&					vkd						= context.getDeviceInterface();
	CommandBufferRenderPassTestEnvironment	env						(context, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT);

	VkCommandBuffer							primaryCommandBuffer	= env.getPrimaryCommandBuffer();
	VkCommandBuffer							secondaryCommandBuffer	= env.getSecondaryCommandBuffer();
	const deUint32							clearColor[4]			= { 2, 47, 131, 211 };

	const VkClearAttachment					clearAttachment			=
	{
		VK_IMAGE_ASPECT_COLOR_BIT,									// VkImageAspectFlags	aspectMask;
		0,															// deUint32				colorAttachment;
		makeClearValueColorU32(clearColor[0],
							   clearColor[1],
							   clearColor[2],
							   clearColor[3])						// VkClearValue			clearValue;
	};

	const VkClearRect						clearRect				=
	{
		CommandBufferRenderPassTestEnvironment::DEFAULT_IMAGE_AREA,	// VkRect2D	rect;
		0u,															// deUint32	baseArrayLayer;
		1u															// deUint32	layerCount;
	};

	env.beginSecondaryCommandBuffer(VK_COMMAND_BUFFER_USAGE_RENDER_PASS_CONTINUE_BIT);
	vkd.cmdClearAttachments(secondaryCommandBuffer, 1, &clearAttachment, 1, &clearRect);
	VK_CHECK(vkd.endCommandBuffer(secondaryCommandBuffer));


	env.beginPrimaryCommandBuffer(0);
	env.beginRenderPass(VK_SUBPASS_CONTENTS_SECONDARY_COMMAND_BUFFERS);
	vkd.cmdExecuteCommands(primaryCommandBuffer, 1, &secondaryCommandBuffer);
	vkd.cmdEndRenderPass(primaryCommandBuffer);

	VK_CHECK(vkd.endCommandBuffer(primaryCommandBuffer));

	env.submitPrimaryCommandBuffer();

	de::MovePtr<tcu::TextureLevel>			result					= env.readColorAttachment();
	tcu::PixelBufferAccess					pixelBufferAccess		= result->getAccess();

	for (deUint32 i = 0; i < (CommandBufferRenderPassTestEnvironment::DEFAULT_IMAGE_SIZE.width * CommandBufferRenderPassTestEnvironment::DEFAULT_IMAGE_SIZE.height); ++i)
	{
		deUint8* colorData = reinterpret_cast<deUint8*>(pixelBufferAccess.getDataPtr());
		for (int colorComponent = 0; colorComponent < 4; ++colorComponent)
			if (colorData[i * 4 + colorComponent] != clearColor[colorComponent])
				return tcu::TestStatus::fail("clear value mismatch");
	}

	return tcu::TestStatus::pass("render pass continue test passed");
}